

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_date<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<local_date,_local_date_format_info,_region>_> *p_Var2;
  value_type *this;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  type reg;
  type fmt;
  type val;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  context<toml::type_config> *in_stack_00000ab0;
  location *in_stack_00000ab8;
  failure_type *in_stack_fffffffffffffc08;
  region *s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffc10;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  undefined1 local_3b0 [24];
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  *in_stack_fffffffffffffc68;
  source_location in_stack_fffffffffffffc70;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined2 local_324;
  undefined1 uStack_322;
  undefined1 uStack_321;
  undefined8 in_stack_fffffffffffffcf8;
  region local_188;
  undefined **local_120;
  undefined **local_110;
  __tuple_element_t<0UL,_tuple<local_date,_local_date_format_info,_region>_> local_104;
  undefined4 local_100;
  undefined **local_f0;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  local_90;
  
  parse_local_date_only<toml::type_config>(in_stack_00000ab8,in_stack_00000ab0);
  bVar1 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          ::is_err(&local_90);
  if (bVar1) {
    local_f0 = &PTR_s__workspace_llm4binary_github_lic_00a5f2f8;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap_err(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    err<toml::error_info&>((error_info *)in_stack_fffffffffffffc68);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x73313f);
    local_100 = 1;
  }
  else {
    local_110 = &PTR_s__workspace_llm4binary_github_lic_00a5f310;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    p_Var2 = std::get<0ul,toml::local_date,toml::local_date_format_info,toml::detail::region>
                       ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                         *)0x7331c3);
    local_104 = *p_Var2;
    local_120 = &PTR_s__workspace_llm4binary_github_lic_00a5f328;
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::unwrap(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    std::get<1ul,toml::local_date,toml::local_date_format_info,toml::detail::region>
              ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region> *)
               0x733201);
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    std::get<2ul,toml::local_date,toml::local_date_format_info,toml::detail::region>
              ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region> *)
               0x733236);
    s = &local_188;
    region::region((region *)in_stack_fffffffffffffc10,s);
    local_324 = local_104.year;
    uStack_322 = local_104.month;
    uStack_321 = local_104.day;
    local_348._0_1_ = false;
    local_348._1_7_ = 0;
    uStack_340 = (pointer)0x0;
    local_338 = 0;
    this_00 = (result<toml::basic_value<toml::type_config>,_toml::error_info> *)&local_348;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x733281);
    region::region((region *)this_00,s);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)&stack0xfffffffffffffce0,_local_324,this_00,
               local_3b0);
    ok<toml::basic_value<toml::type_config>>
              ((basic_value<toml::type_config> *)in_stack_fffffffffffffcf8);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (this_00,(success_type *)s);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x7332ec);
    basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)this_00);
    region::~region((region *)this_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    local_100 = 1;
    region::~region((region *)this_00);
  }
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::~result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
             *)0x7333ba);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_date(location& loc, const context<TC>& ctx)
{
    auto val_fmt_reg = parse_local_date_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}